

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathFrustumTest.h
# Opt level: O0

void __thiscall
Imath_2_5::FrustumTest<float>::setFrustum
          (FrustumTest<float> *this,Frustum<float> *frustum,Matrix44<float> *cameraMat)

{
  Matrix44<float> *in_RDX;
  Frustum<float> *in_RSI;
  long in_RDI;
  float fVar1;
  float fVar2;
  float fVar3;
  Matrix44<float> *in_stack_00000020;
  Plane3<float> *in_stack_00000028;
  Frustum<float> *in_stack_00000030;
  int index;
  int i;
  Plane3<float> frustumPlanes [6];
  Matrix44<float> **local_e0;
  Vec3<float> local_d4;
  Vec3<float> local_c8;
  Vec3<float> local_bc;
  Vec3<float> local_b0;
  Vec3<float> local_a4;
  Vec3<float> local_98;
  Vec3<float> local_8c;
  int local_80;
  int local_7c;
  undefined8 local_78;
  float afStack_70 [22];
  Matrix44<float> *local_18;
  Frustum<float> *local_10;
  
  local_e0 = (Matrix44<float> **)&local_78;
  local_18 = in_RDX;
  local_10 = in_RSI;
  do {
    Plane3<float>::Plane3((Plane3<float> *)0x15b3d4);
    local_e0 = local_e0 + 2;
  } while (local_e0 != &local_18);
  Frustum<float>::planes(in_stack_00000030,in_stack_00000028,in_stack_00000020);
  for (local_7c = 0; local_7c < 2; local_7c = local_7c + 1) {
    local_80 = local_7c * 3;
    Vec3<float>::Vec3(&local_8c,*(float *)(&local_78 + (long)local_80 * 2),
                      *(float *)(&local_78 + (long)(local_80 + 1) * 2),
                      *(float *)(&local_78 + (long)(local_80 + 2) * 2));
    Vec3<float>::operator=((Vec3<float> *)(in_RDI + (long)local_7c * 0xc),&local_8c);
    Vec3<float>::Vec3(&local_98,*(float *)((long)&local_78 + (long)local_80 * 0x10 + 4),
                      *(float *)((long)&local_78 + (long)(local_80 + 1) * 0x10 + 4),
                      *(float *)((long)&local_78 + (long)(local_80 + 2) * 0x10 + 4));
    Vec3<float>::operator=((Vec3<float> *)(in_RDI + 0x18 + (long)local_7c * 0xc),&local_98);
    Vec3<float>::Vec3(&local_a4,afStack_70[(long)local_80 * 4],afStack_70[(long)(local_80 + 1) * 4],
                      afStack_70[(long)(local_80 + 2) * 4]);
    Vec3<float>::operator=((Vec3<float> *)(in_RDI + 0x30 + (long)local_7c * 0xc),&local_a4);
    fVar1 = abs<float>(*(float *)(in_RDI + (long)local_7c * 0xc));
    fVar2 = abs<float>(*(float *)(in_RDI + (long)local_7c * 0xc + 4));
    fVar3 = abs<float>(*(float *)(in_RDI + (long)local_7c * 0xc + 8));
    Vec3<float>::Vec3(&local_b0,fVar1,fVar2,fVar3);
    Vec3<float>::operator=((Vec3<float> *)(in_RDI + 0x60 + (long)local_7c * 0xc),&local_b0);
    fVar1 = abs<float>(*(float *)(in_RDI + 0x18 + (long)local_7c * 0xc));
    fVar2 = abs<float>(*(float *)(in_RDI + (long)local_7c * 0xc + 0x1c));
    fVar3 = abs<float>(*(float *)(in_RDI + (long)local_7c * 0xc + 0x20));
    Vec3<float>::Vec3(&local_bc,fVar1,fVar2,fVar3);
    Vec3<float>::operator=((Vec3<float> *)(in_RDI + 0x78 + (long)local_7c * 0xc),&local_bc);
    fVar1 = abs<float>(*(float *)(in_RDI + 0x30 + (long)local_7c * 0xc));
    fVar2 = abs<float>(*(float *)(in_RDI + (long)local_7c * 0xc + 0x34));
    fVar3 = abs<float>(*(float *)(in_RDI + (long)local_7c * 0xc + 0x38));
    Vec3<float>::Vec3(&local_c8,fVar1,fVar2,fVar3);
    Vec3<float>::operator=((Vec3<float> *)(in_RDI + 0x90 + (long)local_7c * 0xc),&local_c8);
    Vec3<float>::Vec3(&local_d4,afStack_70[(long)local_80 * 4 + 1],
                      afStack_70[(long)(local_80 + 1) * 4 + 1],
                      afStack_70[(long)(local_80 + 2) * 4 + 1]);
    Vec3<float>::operator=((Vec3<float> *)(in_RDI + 0x48 + (long)local_7c * 0xc),&local_d4);
  }
  Frustum<float>::operator=((Frustum<float> *)(in_RDI + 0xa8),local_10);
  Matrix44<float>::operator=((Matrix44<float> *)(in_RDI + 0xd0),local_18);
  return;
}

Assistant:

void FrustumTest<T>::setFrustum(const Frustum<T> &frustum,
                                const Matrix44<T> &cameraMat)
{
    Plane3<T> frustumPlanes[6];
    frustum.planes(frustumPlanes, cameraMat);

    // Here's where we effectively transpose the plane equations.
    // We stuff all six X's into the two planeNormX vectors, etc.
    for (int i = 0; i < 2; ++i)
    {
        int index = i * 3;

        planeNormX[i]     = Vec3<T>(frustumPlanes[index + 0].normal.x,
                                    frustumPlanes[index + 1].normal.x, 
                                    frustumPlanes[index + 2].normal.x);
        planeNormY[i]     = Vec3<T>(frustumPlanes[index + 0].normal.y,
                                    frustumPlanes[index + 1].normal.y,
                                    frustumPlanes[index + 2].normal.y);
        planeNormZ[i]     = Vec3<T>(frustumPlanes[index + 0].normal.z,
                                    frustumPlanes[index + 1].normal.z,
                                    frustumPlanes[index + 2].normal.z);

        planeNormAbsX[i]  = Vec3<T>(IMATH_INTERNAL_NAMESPACE::abs(planeNormX[i].x),
                                    IMATH_INTERNAL_NAMESPACE::abs(planeNormX[i].y), 
                                    IMATH_INTERNAL_NAMESPACE::abs(planeNormX[i].z));
        planeNormAbsY[i]  = Vec3<T>(IMATH_INTERNAL_NAMESPACE::abs(planeNormY[i].x), 
                                    IMATH_INTERNAL_NAMESPACE::abs(planeNormY[i].y),
                                    IMATH_INTERNAL_NAMESPACE::abs(planeNormY[i].z));
        planeNormAbsZ[i]  = Vec3<T>(IMATH_INTERNAL_NAMESPACE::abs(planeNormZ[i].x), 
                                    IMATH_INTERNAL_NAMESPACE::abs(planeNormZ[i].y),
                                    IMATH_INTERNAL_NAMESPACE::abs(planeNormZ[i].z));

        planeOffsetVec[i] = Vec3<T>(frustumPlanes[index + 0].distance,
                                    frustumPlanes[index + 1].distance,
                                    frustumPlanes[index + 2].distance);
    }
    currFrustum = frustum;
    cameraMatrix = cameraMat;
}